

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

void duckdb::DecimalRoundNegativePrecisionFunction<short,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  ulong count;
  short *psVar5;
  short *psVar6;
  unsigned_long *puVar7;
  data_ptr_t pdVar8;
  data_ptr_t pdVar9;
  sel_t *psVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  byte bVar13;
  byte bVar14;
  BoundFunctionExpression *pBVar15;
  pointer pFVar16;
  const_reference pvVar17;
  pointer pEVar18;
  reference vector;
  TemplatedValidityData<unsigned_long> *pTVar19;
  short sVar20;
  short sVar21;
  ulong uVar22;
  ulong uVar23;
  unsigned_long uVar24;
  idx_t idx_in_entry;
  ulong uVar25;
  ulong uVar26;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  data_ptr_t local_90;
  buffer_ptr<ValidityBuffer> *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pBVar15 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar16 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar15->bind_info);
  pvVar17 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&pBVar15->children,0);
  pEVar18 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar17);
  bVar13 = DecimalType::GetScale(&pEVar18->return_type);
  pvVar17 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&pBVar15->children,0);
  pEVar18 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar17);
  bVar14 = DecimalType::GetWidth(&pEVar18->return_type);
  iVar4 = *(int *)&pFVar16[1]._vptr_FunctionData;
  if ((int)((uint)bVar13 - (uint)bVar14) < iVar4) {
    sVar2 = *(short *)(NumericHelper::POWERS_OF_TEN + (long)(int)((uint)bVar13 - iVar4) * 8);
    sVar3 = *(short *)(NumericHelper::POWERS_OF_TEN + (long)iVar4 * -8);
    sVar21 = (short)((uint)(int)(short)(sVar2 - (sVar2 >> 0xf)) >> 1);
    vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
    count = input->count;
    if (vector->vector_type == FLAT_VECTOR) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar9 = result->data;
      pdVar8 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      puVar7 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar7 == (unsigned_long *)0x0) {
        if (count != 0) {
          uVar25 = 0;
          do {
            sVar20 = sVar21;
            if (*(short *)(pdVar8 + uVar25 * 2) < 0) {
              sVar20 = -sVar21;
            }
            *(short *)(pdVar9 + uVar25 * 2) =
                 ((short)(sVar20 + *(short *)(pdVar8 + uVar25 * 2)) / sVar2) * sVar3;
            uVar25 = uVar25 + 1;
          } while (count != uVar25);
        }
      }
      else {
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar7;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if (0x3f < count + 0x3f) {
          puVar7 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          uVar23 = 0;
          uVar25 = 0;
          do {
            if (puVar7 == (unsigned_long *)0x0) {
              uVar24 = 0xffffffffffffffff;
            }
            else {
              uVar24 = puVar7[uVar23];
            }
            uVar26 = uVar25 + 0x40;
            if (count <= uVar25 + 0x40) {
              uVar26 = count;
            }
            uVar22 = uVar26;
            if (uVar24 != 0) {
              uVar22 = uVar25;
              if (uVar24 == 0xffffffffffffffff) {
                if (uVar25 < uVar26) {
                  do {
                    sVar20 = sVar21;
                    if (*(short *)(pdVar8 + uVar22 * 2) < 0) {
                      sVar20 = -sVar21;
                    }
                    *(short *)(pdVar9 + uVar22 * 2) =
                         ((short)(sVar20 + *(short *)(pdVar8 + uVar22 * 2)) / sVar2) * sVar3;
                    uVar22 = uVar22 + 1;
                  } while (uVar26 != uVar22);
                }
              }
              else if (uVar25 < uVar26) {
                uVar22 = 0;
                do {
                  if ((uVar24 >> (uVar22 & 0x3f) & 1) != 0) {
                    sVar20 = sVar21;
                    if (*(short *)(pdVar8 + uVar22 * 2 + uVar25 * 2) < 0) {
                      sVar20 = -sVar21;
                    }
                    *(short *)(pdVar9 + uVar22 * 2 + uVar25 * 2) =
                         ((short)(sVar20 + *(short *)(pdVar8 + uVar22 * 2 + uVar25 * 2)) / sVar2) *
                         sVar3;
                  }
                  uVar22 = uVar22 + 1;
                } while ((uVar25 - uVar26) + uVar22 != 0);
                uVar22 = uVar25 + uVar22;
              }
            }
            uVar23 = uVar23 + 1;
            uVar25 = uVar22;
          } while (uVar23 != count + 0x3f >> 6);
        }
      }
    }
    else if (vector->vector_type == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      psVar5 = (short *)result->data;
      psVar6 = (short *)vector->data;
      puVar7 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar7 != (unsigned_long *)0x0) && ((*puVar7 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      sVar20 = -sVar21;
      if (-1 < *psVar6) {
        sVar20 = sVar21;
      }
      *psVar5 = sVar3 * ((short)(sVar20 + *psVar6) / sVar2);
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
      Vector::ToUnifiedFormat(vector,count,&local_78);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar9 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          psVar10 = (local_78.sel)->sel_vector;
          uVar25 = 0;
          do {
            uVar23 = uVar25;
            if (psVar10 != (sel_t *)0x0) {
              uVar23 = (ulong)psVar10[uVar25];
            }
            sVar20 = sVar21;
            if (*(short *)(local_78.data + uVar23 * 2) < 0) {
              sVar20 = -sVar21;
            }
            *(short *)(pdVar9 + uVar25 * 2) =
                 ((short)(sVar20 + *(short *)(local_78.data + uVar23 * 2)) / sVar2) * sVar3;
            uVar25 = uVar25 + 1;
          } while (count != uVar25);
        }
      }
      else if (count != 0) {
        psVar10 = (local_78.sel)->sel_vector;
        local_88 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar25 = 0;
        local_90 = local_78.data;
        do {
          uVar23 = uVar25;
          if (psVar10 != (sel_t *)0x0) {
            uVar23 = (ulong)psVar10[uVar25];
          }
          if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar23 >> 6] >> (uVar23 & 0x3f) & 1) == 0) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_a8,&local_80);
              p_Var12 = p_Stack_a0;
              peVar11 = local_a8;
              local_a8 = (element_type *)0x0;
              p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar11;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var12;
              if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
              }
              if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
              }
              pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_88);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar19->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              local_78.data = local_90;
            }
            bVar13 = (byte)uVar25 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar25 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
          }
          else {
            sVar20 = sVar21;
            if (*(short *)(local_78.data + uVar23 * 2) < 0) {
              sVar20 = -sVar21;
            }
            *(short *)(pdVar9 + uVar25 * 2) =
                 ((short)(sVar20 + *(short *)(local_78.data + uVar23 * 2)) / sVar2) * sVar3;
          }
          uVar25 = uVar25 + 1;
        } while (count != uVar25);
      }
      if (local_78.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
  }
  else {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    Value::INTEGER((Value *)&local_78,0);
    Vector::SetValue(result,0,(Value *)&local_78);
    Value::~Value((Value *)&local_78);
  }
  return;
}

Assistant:

static void DecimalRoundNegativePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	auto width = DecimalType::GetWidth(func_expr.children[0]->return_type);
	if (info.target_scale <= -int32_t(width - source_scale)) {
		// scale too big for width
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		result.SetValue(0, Value::INTEGER(0));
		return;
	}
	T divide_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale + source_scale]);
	T multiply_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale]);
	T addition = divide_power_of_ten / 2;

	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / divide_power_of_ten * multiply_power_of_ten);
	});
}